

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Scope * equiv_D_Scope(D_Scope *current)

{
  D_Sym *pDVar1;
  D_Scope *pDVar2;
  D_Sym **ppDVar3;
  D_Scope *pDVar4;
  D_Scope *pDVar5;
  D_Scope *s;
  
  if (current == (D_Scope *)0x0) {
    pDVar4 = (D_Scope *)0x0;
  }
  else {
    pDVar4 = current;
    pDVar5 = current;
    do {
      if (pDVar5->depth < current->depth) {
        return pDVar4;
      }
      pDVar2 = pDVar4;
      if ((pDVar5->depth == pDVar4->depth) && (pDVar2 = pDVar5, current->up != pDVar5->up)) {
        return pDVar4;
      }
      pDVar4 = pDVar2;
      if (((pDVar5->ll != (D_Sym *)0x0) || (pDVar5->hash != (D_SymHash *)0x0)) ||
         (pDVar5->dynamic != (D_Scope *)0x0)) {
        return pDVar4;
      }
      ppDVar3 = &pDVar5->updates;
      while (pDVar1 = *ppDVar3, pDVar1 != (D_Sym *)0x0) {
        ppDVar3 = &pDVar1->next;
        if (pDVar1->scope->depth <= current->depth) {
          return pDVar4;
        }
      }
      pDVar5 = pDVar5->up_updates;
    } while (pDVar5 != (D_Scope *)0x0);
  }
  return pDVar4;
}

Assistant:

D_Scope *equiv_D_Scope(D_Scope *current) {
  D_Scope *s = current, *last = current;
  D_Sym *sy;
  if (!s) return s;
  while (s->depth >= current->depth) {
    if (s->depth == last->depth) {
      if (current->up == s->up)
        last = s;
      else
        break;
    }
    if (s->ll || s->hash) break;
    if (s->dynamic) break;
    sy = s->updates;
    while (sy) {
      if (sy->scope->depth <= current->depth) break;
      sy = sy->next;
    }
    if (sy) break;
    if (!s->up_updates) break;
    s = s->up_updates;
  }
  return last;
}